

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::DtlsSession::Send
          (Error *__return_storage_ptr__,DtlsSession *this,ByteArray *aBuf,MessageSubType aSubType)

{
  bool bVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  format_args args;
  string_view fmt;
  byte local_201;
  Error local_1c0;
  byte local_191;
  Error local_190;
  ErrorCode local_164;
  Error local_160;
  anon_class_1_0_00000001 local_122;
  v10 local_121;
  v10 *local_120;
  size_t local_118;
  string local_110;
  Error local_f0;
  undefined1 local_c2;
  MessageSubType local_c1;
  ByteArray *pBStack_c0;
  MessageSubType aSubType_local;
  ByteArray *aBuf_local;
  DtlsSession *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  local_c2 = 0;
  local_c1 = aSubType;
  pBStack_c0 = aBuf;
  aBuf_local = (ByteArray *)this;
  this_local = (DtlsSession *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  if (this->mState == kConnected) {
    bVar1 = std::
            queue<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::deque<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ot::commissioner::MessageSubType>_>_>_>
            ::empty(&this->mSendQueue);
    if (bVar1) {
      Write(&local_160,this,pBStack_c0,local_c1);
      Error::operator=(__return_storage_ptr__,&local_160);
      Error::~Error(&local_160);
      local_164 = kNone;
      local_191 = 0;
      bVar1 = commissioner::operator!=(__return_storage_ptr__,&local_164);
      local_201 = 0;
      if (bVar1) {
        Error::Error(&local_190,__return_storage_ptr__);
        local_191 = 1;
        bVar1 = ShouldStop(&local_190);
        local_201 = bVar1 ^ 0xff;
      }
      if ((local_191 & 1) != 0) {
        Error::~Error(&local_190);
      }
      if ((local_201 & 1) != 0) {
        std::
        queue<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>>
        ::
        emplace<std::vector<unsigned_char,std::allocator<unsigned_char>>const&,ot::commissioner::MessageSubType&>
                  ((queue<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>>
                    *)&this->mSendQueue,pBStack_c0,&local_c1);
        Error::Error(&local_1c0);
        Error::operator=(__return_storage_ptr__,&local_1c0);
        Error::~Error(&local_1c0);
      }
    }
    else {
      std::
      queue<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>>
      ::
      emplace<std::vector<unsigned_char,std::allocator<unsigned_char>>const&,ot::commissioner::MessageSubType&>
                ((queue<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::deque<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>,ot::commissioner::MessageSubType>>>>
                  *)&this->mSendQueue,pBStack_c0,&local_c1);
    }
  }
  else {
    Send::anon_class_1_0_00000001::operator()(&local_122);
    local_58 = &local_120;
    local_60 = &local_121;
    bVar2 = ::fmt::v10::operator()(local_60);
    local_118 = bVar2.size_;
    local_120 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_110;
    local_78 = local_120;
    sStack_70 = local_118;
    local_50 = &local_78;
    local_88 = local_120;
    local_80 = local_118;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_20 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_110,local_88,fmt,args);
    Error::Error(&local_f0,kInvalidState,&local_110);
    Error::operator=(__return_storage_ptr__,&local_f0);
    Error::~Error(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
  }
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::Send(const ByteArray &aBuf, MessageSubType aSubType)
{
    Error error;

    VerifyOrExit(mState == State::kConnected, error = ERROR_INVALID_STATE("the DTLS session is not connected"));

    if (mSendQueue.empty())
    {
        error = Write(aBuf, aSubType);
        if (error != ErrorCode::kNone && !ShouldStop(error))
        {
            mSendQueue.emplace(aBuf, aSubType);

            // hide non-critical error (IO Busy) from caller.
            error = ERROR_NONE;
        }
    }
    else
    {
        mSendQueue.emplace(aBuf, aSubType);
    }

exit:
    return error;
}